

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

Gia_Man_t * Gia_ManFlipUnfold(Gia_Man_t *p,Vec_Int_t *vMap)

{
  uint uVar1;
  char *__s;
  Gia_Obj_t *pGVar2;
  int iVar3;
  uint uVar4;
  Gia_Man_t *p_00;
  size_t sVar5;
  char *__dest;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  Vec_Int_t *pVVar9;
  Gia_Man_t *pGVar10;
  Gia_Obj_t *pObj;
  long lVar11;
  long lVar12;
  uint local_44;
  
  p_00 = Gia_ManStart(p->nObjs << 2);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar5 = strlen(__s);
    __dest = (char *)malloc(sVar5 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      iVar3 = pVVar9->pArray[lVar11];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0058c6d0;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar6 = Gia_ManAppendObj(p_00);
      uVar8 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar8 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar8 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar7 = p_00->pObjs;
      if ((pGVar6 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar6)) goto LAB_0058c6b1;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar7) >> 2) * -0x55555555);
      pGVar7 = p_00->pObjs;
      if ((pGVar6 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar6)) goto LAB_0058c6b1;
      pGVar2[iVar3].Value = (int)((ulong)((long)pGVar6 - (long)pGVar7) >> 2) * 0x55555556;
      lVar11 = lVar11 + 1;
      pVVar9 = p->vCis;
    } while (lVar11 < pVVar9->nSize);
  }
  if (p->nObjs < 1) {
    local_44 = 0;
  }
  else {
    lVar11 = 0;
    lVar12 = 8;
    local_44 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar8 = *(ulong *)((long)pGVar2 + lVar12 + -8);
      if ((uVar8 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar8) {
        uVar4 = *(uint *)((long)pGVar2 + lVar12 + (ulong)(uint)((int)(uVar8 & 0x1fffffff) << 2) * -3
                         );
        if (((int)uVar4 < 0) ||
           (uVar1 = *(uint *)((long)pGVar2 +
                             lVar12 + (ulong)((uint)(uVar8 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) goto LAB_0058c6ef;
        iVar3 = Gia_ManHashAnd(p_00,uVar4 ^ (uint)(uVar8 >> 0x1d) & 1,
                               uVar1 ^ (uint)(uVar8 >> 0x3d) & 1);
        *(int *)(&pGVar2->field_0x0 + lVar12) = iVar3;
        if (((int)local_44 < 0) || (vMap->nSize <= (int)local_44)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar8 = (ulong)local_44;
        local_44 = local_44 + 1;
        iVar3 = vMap->pArray[uVar8];
        pGVar7 = Gia_ManAppendObj(p_00);
        uVar8 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 = uVar8 | 0x9fffffff;
        uVar8 = uVar8 & 0xe0000000ffffffff | 0x9fffffff;
        if (iVar3 == 0) {
          *(ulong *)pGVar7 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar8;
          pGVar2 = p_00->pObjs;
          if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) goto LAB_0058c6b1;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
          if ((pGVar7 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar7)) goto LAB_0058c6b1;
        }
        else {
          *(ulong *)pGVar7 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar8;
          pGVar6 = p_00->pObjs;
          if ((pGVar7 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar7)) {
LAB_0058c6b1:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar6) >> 2) * -0x55555555);
          pGVar6 = p_00->pObjs;
          if ((pGVar7 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar7)) goto LAB_0058c6b1;
          iVar3 = Gia_ManHashXor(p_00,(int)((ulong)((long)pGVar7 - (long)pGVar6) >> 2) * 0x55555556,
                                 *(int *)(&pGVar2->field_0x0 + lVar12));
          *(int *)(&pGVar2->field_0x0 + lVar12) = iVar3;
        }
      }
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 0xc;
    } while (lVar11 < p->nObjs);
  }
  if (local_44 != vMap->nSize) {
    __assert_fail("iFuncVars == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x200,"Gia_Man_t *Gia_ManFlipUnfold(Gia_Man_t *, Vec_Int_t *)");
  }
  pVVar9 = p->vCos;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      iVar3 = pVVar9->pArray[lVar11];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_0058c6d0:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar3;
      if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0) {
LAB_0058c6ef:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar4 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                   pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value)
      ;
      pGVar2->Value = uVar4;
      lVar11 = lVar11 + 1;
      pVVar9 = p->vCos;
    } while (lVar11 < pVVar9->nSize);
  }
  pGVar10 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  iVar3 = p->vCis->nSize;
  if (pGVar10->vCis->nSize - pGVar10->nRegs != iVar3 + p->nObjs + ~(p->vCos->nSize + iVar3)) {
    __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + Gia_ManAndNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x205,"Gia_Man_t *Gia_ManFlipUnfold(Gia_Man_t *, Vec_Int_t *)");
  }
  return pGVar10;
}

Assistant:

Gia_Man_t * Gia_ManFlipUnfold( Gia_Man_t * p, Vec_Int_t * vMap )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iFuncVars = 0;
    pNew = Gia_ManStart( 4 * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( Vec_IntEntry(vMap, iFuncVars++) )
            pObj->Value = Gia_ManHashXor( pNew, Gia_ManAppendCi(pNew), pObj->Value );
        else
            Gia_ManAppendCi(pNew);
    }
    assert( iFuncVars == Vec_IntSize(vMap) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + Gia_ManAndNum(p) );
    return pNew;
}